

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O1

void threshold_tilde_set(t_threshold_tilde *x,t_floatarg hithresh,t_floatarg hideadtime,
                        t_floatarg lothresh,t_floatarg lodeadtime)

{
  x->x_hithresh = hithresh;
  if (lothresh <= hithresh) {
    hithresh = lothresh;
  }
  x->x_hideadtime = hideadtime;
  x->x_lothresh = hithresh;
  x->x_lodeadtime = lodeadtime;
  return;
}

Assistant:

static void threshold_tilde_set(t_threshold_tilde *x,
    t_floatarg hithresh, t_floatarg hideadtime,
    t_floatarg lothresh, t_floatarg lodeadtime)
{
    if (lothresh > hithresh)
        lothresh = hithresh;
    x->x_hithresh = hithresh;
    x->x_hideadtime = hideadtime;
    x->x_lothresh = lothresh;
    x->x_lodeadtime = lodeadtime;
}